

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

void __thiscall json11::Json::Json(Json *this,bool value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  shared_ptr<json11::JsonValue> *psVar2;
  shared_ptr<json11::JsonValue> *psVar3;
  undefined3 in_register_00000031;
  bool bVar4;
  
  statics();
  psVar3 = &statics::s.f;
  bVar4 = CONCAT31(in_register_00000031,value) != 0;
  if (bVar4) {
    psVar3 = &statics::s.t;
  }
  psVar2 = &statics::s.f;
  if (bVar4) {
    psVar2 = &statics::s.t;
  }
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (psVar3->super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (psVar2->super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

Json::Json(bool value)                 : m_ptr(value ? statics().t : statics().f) {}